

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-logging.cc
# Opt level: O1

void __thiscall wabt::BinaryReaderLogging::LogType(BinaryReaderLogging *this,Type type)

{
  char *pcVar1;
  
  if (I32 < type) {
    Stream::Writef(this->stream_,"funcidx[%d]");
    return;
  }
  if (type < Anyfunc) {
    if (type == Void) {
      pcVar1 = "void";
      goto LAB_00f4ee04;
    }
    if (type == Func) {
      pcVar1 = "func";
      goto LAB_00f4ee04;
    }
    if (type == ExceptRef) {
      pcVar1 = "except_ref";
      goto LAB_00f4ee04;
    }
switchD_00f4ed92_caseD_fffffff1:
    pcVar1 = "<type index>";
  }
  else {
    switch(type) {
    case Any:
      pcVar1 = "any";
      break;
    case Anyfunc:
      pcVar1 = "anyfunc";
      break;
    default:
      goto switchD_00f4ed92_caseD_fffffff1;
    case V128:
      pcVar1 = "v128";
      break;
    case F64:
      pcVar1 = "f64";
      break;
    case F32:
      pcVar1 = "f32";
      break;
    case I64:
      pcVar1 = "i64";
      break;
    case I32:
      pcVar1 = "i32";
    }
  }
LAB_00f4ee04:
  Stream::Writef(this->stream_,"%s",pcVar1);
  return;
}

Assistant:

void BinaryReaderLogging::LogType(Type type) {
  if (IsTypeIndex(type)) {
    LOGF_NOINDENT("funcidx[%d]", static_cast<int>(type));
  } else {
    LOGF_NOINDENT("%s", GetTypeName(type));
  }
}